

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fTessellationGeometryInteractionTests.cpp
# Opt level: O2

IterateResult __thiscall
deqp::gles31::Functional::anon_unknown_1::IdentityGeometryShaderCase::iterate
          (IdentityGeometryShaderCase *this)

{
  undefined1 *this_00;
  CaseType CVar1;
  TestLog *pTVar2;
  bool bVar3;
  int iVar4;
  deUint32 dVar5;
  int iVar6;
  int iVar7;
  undefined4 extraout_var;
  ProgramSources *pPVar9;
  ostream *poVar10;
  TestError *pTVar11;
  char *pcVar12;
  char *pcVar13;
  long lVar14;
  ContextType local_48c;
  undefined1 local_488 [8];
  _Alloc_hider _Stack_480;
  ScopedLogSection section;
  VertexArray vao;
  undefined1 local_428 [40];
  Surface resultWithoutGeometry;
  Surface resultWithGeometry;
  undefined1 local_3d0 [40];
  string local_3a8;
  string local_388;
  string local_368;
  string local_348;
  string local_328;
  anon_struct_64_4_0b5d5edf renderTargets [2];
  ProgramSources sources;
  ostringstream buf;
  long lVar8;
  
  iVar4 = (*((this->super_IdentityShaderCase).super_TestCase.m_context)->m_renderCtx->
            _vptr_RenderContext[3])();
  lVar8 = CONCAT44(extraout_var,iVar4);
  tcu::Surface::Surface(&resultWithGeometry,0x80,0x80);
  tcu::Surface::Surface(&resultWithoutGeometry,0x80,0x80);
  renderTargets[0].name = "RenderWithGeometryShader";
  renderTargets[0].description = "Render with geometry shader";
  renderTargets[0].containsGeometryShader = true;
  tcu::Surface::getAccess(&renderTargets[0].surfaceAccess,&resultWithGeometry);
  renderTargets[1].name = "RenderWithoutGeometryShader";
  renderTargets[1].description = "Render without geometry shader";
  renderTargets[1].containsGeometryShader = false;
  tcu::Surface::getAccess(&renderTargets[1].surfaceAccess,&resultWithoutGeometry);
  (**(code **)(lVar8 + 0x1a00))(0,0,0x80,0x80);
  (**(code **)(lVar8 + 0x1c0))(0,0,0,0x3f800000);
  dVar5 = (**(code **)(lVar8 + 0x800))();
  glu::checkError(dVar5,"set viewport",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fTessellationGeometryInteractionTests.cpp"
                  ,0xf6);
  (**(code **)(lVar8 + 0x5e0))(0xbe2);
  (**(code **)(lVar8 + 0x120))(0x302,1);
  (**(code **)(lVar8 + 0x100))(0x8006);
  dVar5 = (**(code **)(lVar8 + 0x800))();
  glu::checkError(dVar5,"set blend",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fTessellationGeometryInteractionTests.cpp"
                  ,0xfb);
  buf.super_basic_ostream<char,_std::char_traits<char>_>._vptr_basic_ostream =
       (_func_int **)
       ((this->super_IdentityShaderCase).super_TestCase.super_TestCase.super_TestNode.m_testCtx)->
       m_log;
  this_00 = &buf.super_basic_ostream<char,_std::char_traits<char>_>.field_0x8;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)this_00);
  std::operator<<((ostream *)this_00,"Tessellation level: inner ");
  std::ostream::operator<<(this_00,14.0);
  std::operator<<((ostream *)this_00,", outer ");
  std::ostream::operator<<(this_00,14.0);
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)&buf,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)this_00);
  lVar14 = 0;
  do {
    if (lVar14 == 0x80) {
      pTVar2 = ((this->super_IdentityShaderCase).super_TestCase.super_TestCase.super_TestNode.
               m_testCtx)->m_log;
      tcu::Surface::getAccess((PixelBufferAccess *)&buf,&resultWithoutGeometry);
      tcu::Surface::getAccess((PixelBufferAccess *)&sources,&resultWithGeometry);
      local_488 = (undefined1  [8])0x800000008;
      _Stack_480._M_p = (pointer)0xff00000008;
      vao.super_ObjectWrapper.m_gl = (Functions *)&DAT_100000001;
      vao.super_ObjectWrapper.m_traits._0_4_ = 0;
      bVar3 = tcu::intThresholdPositionDeviationCompare
                        (pTVar2,"ImageCompare","Image comparison",(ConstPixelBufferAccess *)&buf,
                         (ConstPixelBufferAccess *)&sources,(UVec4 *)local_488,(IVec3 *)&vao,true,
                         COMPARE_LOG_RESULT);
      pcVar13 = "Image comparison failed";
      if (bVar3) {
        pcVar13 = "Pass";
      }
      tcu::TestContext::setTestResult
                ((this->super_IdentityShaderCase).super_TestCase.super_TestCase.super_TestNode.
                 m_testCtx,(uint)!bVar3,pcVar13);
      tcu::Surface::~Surface(&resultWithoutGeometry);
      tcu::Surface::~Surface(&resultWithGeometry);
      return STOP;
    }
    pTVar2 = ((this->super_IdentityShaderCase).super_TestCase.super_TestCase.super_TestNode.
             m_testCtx)->m_log;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&buf,
               *(char **)((long)renderTargets[0].surfaceAccess.super_ConstPixelBufferAccess.m_size.
                                m_data + lVar14 + -0x20),(allocator<char> *)local_488);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&sources,
               *(char **)((long)(&renderTargets[0].surfaceAccess.super_ConstPixelBufferAccess.m_size
                                + -2) + lVar14),(allocator<char> *)&vao);
    tcu::ScopedLogSection::ScopedLogSection(&section,pTVar2,(string *)&buf,(string *)&sources);
    std::__cxx11::string::~string((string *)&sources);
    std::__cxx11::string::~string((string *)&buf);
    memset(&sources,0,0xac);
    sources.transformFeedbackVaryings.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    sources.transformFeedbackVaryings.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish._0_1_ = 0;
    sources.transformFeedbackVaryings.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish._1_7_ = 0;
    sources.transformFeedbackVaryings.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage._0_1_ = 0;
    sources._193_8_ = 0;
    Functional::(anonymous_namespace)::IdentityShaderCase::getVertexSource_abi_cxx11_
              (&local_348,this);
    glu::VertexSource::VertexSource((VertexSource *)local_488,&local_348);
    pPVar9 = glu::ProgramSources::operator<<(&sources,(ShaderSource *)local_488);
    Functional::(anonymous_namespace)::IdentityShaderCase::getFragmentSource_abi_cxx11_
              (&local_368,this);
    glu::FragmentSource::FragmentSource((FragmentSource *)&vao,&local_368);
    pPVar9 = glu::ProgramSources::operator<<(pPVar9,(ShaderSource *)&vao);
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&buf);
    std::operator<<((ostream *)&buf,
                    "${VERSION_DECL}\n${EXTENSION_TESSELATION_SHADER}layout(vertices = 4) out;\n\nuniform highp float u_innerTessellationLevel;\nuniform highp float u_outerTessellationLevel;\nin highp vec4 v_vertex_color[];\nout highp vec4 v_patch_color[];\n\nvoid main (void)\n{\n\tgl_out[gl_InvocationID].gl_Position = gl_in[gl_InvocationID].gl_Position;\n\tv_patch_color[gl_InvocationID] = v_vertex_color[gl_InvocationID];\n\n"
                   );
    if ((ulong)this->m_case < 3) {
      std::operator<<((ostream *)&buf,
                      &DAT_018ca890 + *(int *)(&DAT_018ca890 + (ulong)this->m_case * 4));
    }
    std::operator<<((ostream *)&buf,"}\n");
    std::__cxx11::stringbuf::str();
    local_3a8._M_dataplus._M_p._0_4_ =
         (*((this->super_IdentityShaderCase).super_TestCase.m_context)->m_renderCtx->
           _vptr_RenderContext[2])();
    specializeShader(&local_388,(string *)local_3d0,(ContextType *)&local_3a8);
    std::__cxx11::string::~string((string *)local_3d0);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&buf);
    glu::TessellationControlSource::TessellationControlSource
              ((TessellationControlSource *)local_428,&local_388);
    pPVar9 = glu::ProgramSources::operator<<(pPVar9,(ShaderSource *)local_428);
    pcVar13 = "v_fragment_color";
    if (*(char *)((long)renderTargets[0].surfaceAccess.super_ConstPixelBufferAccess.m_size.m_data +
                 lVar14 + -0x10) != '\0') {
      pcVar13 = "v_evaluated_color";
    }
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&buf);
    poVar10 = std::operator<<((ostream *)&buf,
                              "${VERSION_DECL}\n${EXTENSION_TESSELATION_SHADER}layout(");
    pcVar12 = "isolines";
    if (this->m_case == CASE_QUADS) {
      pcVar12 = "quads";
    }
    if (this->m_case == CASE_TRIANGLES) {
      pcVar12 = "triangles";
    }
    poVar10 = std::operator<<(poVar10,pcVar12);
    poVar10 = std::operator<<(poVar10,") in;\n\nin highp vec4 v_patch_color[];\nout highp vec4 ");
    poVar10 = std::operator<<(poVar10,pcVar13);
    std::operator<<(poVar10,
                    ";\n\n// note: No need to use precise gl_Position since we do not require gapless geometry\nvoid main (void)\n{\n"
                   );
    if (this->m_case - CASE_QUADS < 2) {
      poVar10 = std::operator<<((ostream *)&buf,
                                "\tvec2 normalizedCoord = (gl_TessCoord.xy * 2.0 - vec2(1.0));\n\tvec2 normalizedWeights = normalizedCoord * (vec2(1.0) - 0.3 * cos(normalizedCoord.yx * 1.57));\n\tvec2 weights = normalizedWeights * 0.5 + vec2(0.5);\n\tvec2 cweights = gl_TessCoord.xy;\n\tgl_Position = mix(mix(gl_in[0].gl_Position, gl_in[1].gl_Position, weights.y), mix(gl_in[2].gl_Position, gl_in[3].gl_Position, weights.y), weights.x);\n\t"
                               );
      poVar10 = std::operator<<(poVar10,pcVar13);
      pcVar13 = 
      " = mix(mix(v_patch_color[0], v_patch_color[1], cweights.y), mix(v_patch_color[2], v_patch_color[3], cweights.y), cweights.x);\n"
      ;
LAB_013168ee:
      std::operator<<(poVar10,pcVar13);
    }
    else if (this->m_case == CASE_TRIANGLES) {
      poVar10 = std::operator<<((ostream *)&buf,
                                "\tvec3 weights = vec3(pow(gl_TessCoord.x, 1.3), pow(gl_TessCoord.y, 1.3), pow(gl_TessCoord.z, 1.3));\n\tvec3 cweights = gl_TessCoord;\n\tgl_Position = vec4(weights.x * gl_in[0].gl_Position.xyz + weights.y * gl_in[1].gl_Position.xyz + weights.z * gl_in[2].gl_Position.xyz, 1.0);\n\t"
                               );
      poVar10 = std::operator<<(poVar10,pcVar13);
      pcVar13 = 
      " = cweights.x * v_patch_color[0] + cweights.y * v_patch_color[1] + cweights.z * v_patch_color[2];\n"
      ;
      goto LAB_013168ee;
    }
    std::operator<<((ostream *)&buf,"}\n");
    std::__cxx11::stringbuf::str();
    local_48c.super_ApiType.m_bits =
         (ApiType)(*((this->super_IdentityShaderCase).super_TestCase.m_context)->m_renderCtx->
                    _vptr_RenderContext[2])();
    specializeShader(&local_328,&local_3a8,&local_48c);
    std::__cxx11::string::~string((string *)&local_3a8);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&buf);
    glu::TessellationEvaluationSource::TessellationEvaluationSource
              ((TessellationEvaluationSource *)local_3d0,&local_328);
    glu::ProgramSources::operator<<(pPVar9,(ShaderSource *)local_3d0);
    std::__cxx11::string::~string((string *)(local_3d0 + 8));
    std::__cxx11::string::~string((string *)&local_328);
    std::__cxx11::string::~string((string *)(local_428 + 8));
    std::__cxx11::string::~string((string *)&local_388);
    std::__cxx11::string::~string((string *)&vao.super_ObjectWrapper.m_traits);
    std::__cxx11::string::~string((string *)&local_368);
    std::__cxx11::string::~string((string *)&_Stack_480);
    std::__cxx11::string::~string((string *)&local_348);
    if (*(char *)((long)renderTargets[0].surfaceAccess.super_ConstPixelBufferAccess.m_size.m_data +
                 lVar14 + -0x10) == '\x01') {
      CVar1 = this->m_case;
      pcVar13 = "basic-mode-drawElements-triangle_strip";
      if (CVar1 == CASE_ISOLINES) {
        pcVar13 = "basic-mode-drawElements-line_strip";
      }
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&buf);
      poVar10 = std::operator<<((ostream *)&buf,
                                "${VERSION_DECL}\n${EXTENSION_GEOMETRY_SHADER}layout(");
      pcVar12 = "triangles";
      if (CVar1 == CASE_ISOLINES) {
        pcVar12 = "lines";
      }
      poVar10 = std::operator<<(poVar10,pcVar12);
      poVar10 = std::operator<<(poVar10,") in;\nlayout(");
      poVar10 = std::operator<<(poVar10,pcVar13 + 0x18);
      poVar10 = std::operator<<(poVar10,", max_vertices=");
      poVar10 = (ostream *)std::ostream::operator<<(poVar10,CVar1 == CASE_ISOLINES ^ 3);
      std::operator<<(poVar10,
                      ") out;\n\nin highp vec4 v_evaluated_color[];\nout highp vec4 v_fragment_color;\n\nvoid main (void)\n{\n\tfor (int ndx = 0; ndx < gl_in.length(); ++ndx)\n\t{\n\t\tgl_Position = gl_in[ndx].gl_Position;\n\t\tv_fragment_color = v_evaluated_color[ndx];\n\t\tEmitVertex();\n\t}\n}\n"
                     );
      std::__cxx11::stringbuf::str();
      local_3d0._0_4_ =
           (*((this->super_IdentityShaderCase).super_TestCase.m_context)->m_renderCtx->
             _vptr_RenderContext[2])();
      specializeShader((string *)local_428,(string *)&vao,(ContextType *)local_3d0);
      std::__cxx11::string::~string((string *)&vao);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)&buf);
      glu::GeometrySource::GeometrySource((GeometrySource *)local_488,(string *)local_428);
      glu::ProgramSources::operator<<(&sources,(ShaderSource *)local_488);
      std::__cxx11::string::~string((string *)&_Stack_480);
      std::__cxx11::string::~string((string *)local_428);
    }
    glu::ShaderProgram::ShaderProgram
              ((ShaderProgram *)&buf,
               ((this->super_IdentityShaderCase).super_TestCase.m_context)->m_renderCtx,&sources);
    glu::TypedObjectWrapper<(glu::ObjectType)5>::TypedObjectWrapper
              (&vao,((this->super_IdentityShaderCase).super_TestCase.m_context)->m_renderCtx);
    iVar4 = (**(code **)(lVar8 + 0x780))
                      (buf.super_basic_ostream<char,_std::char_traits<char>_>._152_4_,"a_position");
    iVar6 = (**(code **)(lVar8 + 0xb48))
                      (buf.super_basic_ostream<char,_std::char_traits<char>_>._152_4_,
                       "u_innerTessellationLevel");
    iVar7 = (**(code **)(lVar8 + 0xb48))
                      (buf.super_basic_ostream<char,_std::char_traits<char>_>._152_4_,
                       "u_outerTessellationLevel");
    glu::operator<<(((this->super_IdentityShaderCase).super_TestCase.super_TestCase.super_TestNode.
                    m_testCtx)->m_log,(ShaderProgram *)&buf);
    if (buf.super_basic_ostream<char,_std::char_traits<char>_>._192_1_ == '\0') {
      pTVar11 = (TestError *)__cxa_allocate_exception(0x38);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)local_488,"could not build program",(allocator<char> *)local_428);
      tcu::TestError::TestError(pTVar11,(string *)local_488);
      __cxa_throw(pTVar11,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
    }
    if (iVar4 == -1) {
      pTVar11 = (TestError *)__cxa_allocate_exception(0x38);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)local_488,"a_position location was -1",(allocator<char> *)local_428);
      tcu::TestError::TestError(pTVar11,(string *)local_488);
      __cxa_throw(pTVar11,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
    }
    if (iVar7 == -1) {
      pTVar11 = (TestError *)__cxa_allocate_exception(0x38);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)local_488,"u_outerTessellationLevel location was -1",
                 (allocator<char> *)local_428);
      tcu::TestError::TestError(pTVar11,(string *)local_488);
      __cxa_throw(pTVar11,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
    }
    (**(code **)(lVar8 + 0xd8))(vao.super_ObjectWrapper.m_object);
    (**(code **)(lVar8 + 0x40))(0x8892,this->m_patchBuffer);
    (**(code **)(lVar8 + 0x19f0))(iVar4,4,0x1406,0,0,0);
    (**(code **)(lVar8 + 0x610))(iVar4);
    dVar5 = (**(code **)(lVar8 + 0x800))();
    glu::checkError(dVar5,"setup attribs",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fTessellationGeometryInteractionTests.cpp"
                    ,0x121);
    (**(code **)(lVar8 + 0x1680))(buf.super_basic_ostream<char,_std::char_traits<char>_>._152_4_);
    (**(code **)(lVar8 + 0x14e0))(0x41600000,iVar7);
    if (iVar6 == -1) {
      (**(code **)(lVar8 + 0x14e0))(0x41600000,0xffffffffffffffff);
    }
    dVar5 = (**(code **)(lVar8 + 0x800))();
    glu::checkError(dVar5,"use program",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fTessellationGeometryInteractionTests.cpp"
                    ,0x129);
    (**(code **)(lVar8 + 0xfd8))(0x8e72,4 - (uint)(this->m_case == CASE_TRIANGLES));
    dVar5 = (**(code **)(lVar8 + 0x800))();
    glu::checkError(dVar5,"set patch param",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fTessellationGeometryInteractionTests.cpp"
                    ,300);
    (**(code **)(lVar8 + 0x188))(0x4000);
    dVar5 = (**(code **)(lVar8 + 0x800))();
    glu::checkError(dVar5,"clear",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fTessellationGeometryInteractionTests.cpp"
                    ,0x12f);
    (**(code **)(lVar8 + 0x538))(0xe,0,4);
    dVar5 = (**(code **)(lVar8 + 0x800))();
    glu::checkError(dVar5,"draw patches",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fTessellationGeometryInteractionTests.cpp"
                    ,0x132);
    glu::readPixels(((this->super_IdentityShaderCase).super_TestCase.m_context)->m_renderCtx,0,0,
                    (PixelBufferAccess *)
                    ((long)renderTargets[0].surfaceAccess.super_ConstPixelBufferAccess.m_size.m_data
                    + lVar14 + -8));
    glu::ObjectWrapper::~ObjectWrapper(&vao.super_ObjectWrapper);
    glu::ShaderProgram::~ShaderProgram((ShaderProgram *)&buf);
    glu::ProgramSources::~ProgramSources(&sources);
    tcu::ScopedLogSection::~ScopedLogSection(&section);
    lVar14 = lVar14 + 0x40;
  } while( true );
}

Assistant:

IdentityGeometryShaderCase::IterateResult IdentityGeometryShaderCase::iterate (void)
{
	const float				innerTessellationLevel	= 14.0f;
	const float				outerTessellationLevel	= 14.0f;
	const glw::Functions&	gl						= m_context.getRenderContext().getFunctions();
	tcu::Surface			resultWithGeometry		(RENDER_SIZE, RENDER_SIZE);
	tcu::Surface			resultWithoutGeometry	(RENDER_SIZE, RENDER_SIZE);

	const struct
	{
		const char*				name;
		const char*				description;
		bool					containsGeometryShader;
		tcu::PixelBufferAccess	surfaceAccess;
	} renderTargets[] =
	{
		{ "RenderWithGeometryShader",		"Render with geometry shader",		true,	resultWithGeometry.getAccess()		},
		{ "RenderWithoutGeometryShader",	"Render without geometry shader",	false,	resultWithoutGeometry.getAccess()	},
	};

	gl.viewport(0, 0, RENDER_SIZE, RENDER_SIZE);
	gl.clearColor(0.0f, 0.0f, 0.0f, 1.0f);
	GLU_EXPECT_NO_ERROR(gl.getError(), "set viewport");

	gl.enable(GL_BLEND);
	gl.blendFunc(GL_SRC_ALPHA, GL_ONE);
	gl.blendEquation(GL_FUNC_ADD);
	GLU_EXPECT_NO_ERROR(gl.getError(), "set blend");

	m_testCtx.getLog() << tcu::TestLog::Message << "Tessellation level: inner " << innerTessellationLevel << ", outer " << outerTessellationLevel << tcu::TestLog::EndMessage;

	// render with and without geometry shader
	for (int renderNdx = 0; renderNdx < DE_LENGTH_OF_ARRAY(renderTargets); ++renderNdx)
	{
		const tcu::ScopedLogSection	section	(m_testCtx.getLog(), renderTargets[renderNdx].name, renderTargets[renderNdx].description);
		glu::ProgramSources			sources;

		sources	<< glu::VertexSource(getVertexSource())
				<< glu::FragmentSource(getFragmentSource())
				<< glu::TessellationControlSource(getTessellationControlSource())
				<< glu::TessellationEvaluationSource(getTessellationEvaluationSource(renderTargets[renderNdx].containsGeometryShader));

		if (renderTargets[renderNdx].containsGeometryShader)
			sources << glu::GeometrySource(getGeometrySource());

		{
			const glu::ShaderProgram	program					(m_context.getRenderContext(), sources);
			const glu::VertexArray		vao						(m_context.getRenderContext());
			const int					posLocation				= gl.getAttribLocation(program.getProgram(), "a_position");
			const int					innerTessellationLoc	= gl.getUniformLocation(program.getProgram(), "u_innerTessellationLevel");
			const int					outerTessellationLoc	= gl.getUniformLocation(program.getProgram(), "u_outerTessellationLevel");

			m_testCtx.getLog() << program;

			if (!program.isOk())
				throw tcu::TestError("could not build program");
			if (posLocation == -1)
				throw tcu::TestError("a_position location was -1");
			if (outerTessellationLoc == -1)
				throw tcu::TestError("u_outerTessellationLevel location was -1");

			gl.bindVertexArray(*vao);
			gl.bindBuffer(GL_ARRAY_BUFFER, m_patchBuffer);
			gl.vertexAttribPointer(posLocation, 4, GL_FLOAT, GL_FALSE, 0, DE_NULL);
			gl.enableVertexAttribArray(posLocation);
			GLU_EXPECT_NO_ERROR(gl.getError(), "setup attribs");

			gl.useProgram(program.getProgram());
			gl.uniform1f(outerTessellationLoc, outerTessellationLevel);

			if (innerTessellationLoc == -1)
				gl.uniform1f(innerTessellationLoc, innerTessellationLevel);

			GLU_EXPECT_NO_ERROR(gl.getError(), "use program");

			gl.patchParameteri(GL_PATCH_VERTICES, (m_case == CASE_TRIANGLES) ? (3): (4));
			GLU_EXPECT_NO_ERROR(gl.getError(), "set patch param");

			gl.clear(GL_COLOR_BUFFER_BIT);
			GLU_EXPECT_NO_ERROR(gl.getError(), "clear");

			gl.drawArrays(GL_PATCHES, 0, 4);
			GLU_EXPECT_NO_ERROR(gl.getError(), "draw patches");

			glu::readPixels(m_context.getRenderContext(), 0, 0, renderTargets[renderNdx].surfaceAccess);
		}
	}

	if (tcu::intThresholdPositionDeviationCompare(m_testCtx.getLog(),
												  "ImageCompare",
												  "Image comparison",
												  resultWithoutGeometry.getAccess(),
												  resultWithGeometry.getAccess(),
												  tcu::UVec4(8, 8, 8, 255),
												  tcu::IVec3(1, 1, 0),
												  true,
												  tcu::COMPARE_LOG_RESULT))
		m_testCtx.setTestResult(QP_TEST_RESULT_PASS, "Pass");
	else
		m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Image comparison failed");

	return STOP;
}